

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

uchar * mcmalo1(mcmcx1def *ctx,ushort siz,mcmon *nump)

{
  mcmon *lst;
  ushort uVar1;
  ushort uVar2;
  ushort n;
  ulong uVar3;
  ushort *puVar4;
  mcmodef *pmVar5;
  byte bVar6;
  ulong in_RCX;
  mcmon *pmVar7;
  uint uVar8;
  ushort siz_00;
  mcmon n_00;
  mcmodef *pmVar9;
  mcmon local_3e;
  uint local_3c;
  mcmon *local_38;
  
  siz_00 = siz + 7 & 0xfff8;
  local_38 = nump;
  if (0x8000 < siz_00) {
    errsigf(ctx->mcmcxerr,"TADS",0x12);
  }
  lst = &ctx->mcmcxfre;
  uVar3 = 0xffff;
  pmVar5 = (mcmodef *)0x0;
  pmVar7 = lst;
  do {
    while( true ) {
      n = *pmVar7;
      uVar2 = (ushort)uVar3;
      if ((ulong)n == 0xffff) break;
      uVar8 = (uint)(n >> 8);
      bVar6 = (byte)n;
      pmVar9 = ctx->mcmcxtab[n >> 8] + bVar6;
      uVar1 = ctx->mcmcxtab[n >> 8][bVar6].mcmosiz;
      if (uVar1 == siz_00) {
LAB_0012a3c4:
        local_3c = (uint)n;
        mcmunl(ctx,n,lst);
        *(byte *)&pmVar9->mcmoflg = (byte)pmVar9->mcmoflg & 0x7f;
        (pmVar9->mcmoloc).mcmolocs = 0xffff;
        n_00 = (mcmon)local_3c;
        mcmsplt(ctx,n_00,siz_00);
        *(undefined2 *)
         (*(long *)((long)ctx->mcmcxtab + (ulong)(uVar8 << 3)) + 0x14 + (ulong)bVar6 * 0x20) = 0xe;
        *(undefined1 *)
         (*(long *)((long)ctx->mcmcxtab + (ulong)(uVar8 << 3)) + 0x16 + (ulong)bVar6 * 0x20) = 1;
        *local_38 = n_00;
        return pmVar9->mcmoptr;
      }
      if ((siz_00 < uVar1) && ((uVar2 == 0xffff || (uVar1 < (ushort)in_RCX)))) {
        uVar3 = (ulong)n;
        in_RCX = (ulong)uVar1;
        pmVar5 = pmVar9;
      }
      pmVar7 = &pmVar9->mcmonxt;
    }
    if (uVar2 != 0xffff) {
      bVar6 = (byte)uVar3;
      uVar8 = (uint)(uVar3 >> 8);
      pmVar9 = pmVar5;
      n = uVar2;
      goto LAB_0012a3c4;
    }
    local_3e = 0xffff;
    puVar4 = (ushort *)mcmhalo(ctx);
    if (puVar4 == (ushort *)0x0) goto LAB_0012a437;
    pmVar5 = mcmoal(ctx,&local_3e);
    in_RCX = (ulong)local_3e;
    if (local_3e == 0xffff) {
      ctx->mcmcxhpch = *(mcmhdef **)(puVar4 + -4);
      free(puVar4 + -4);
LAB_0012a437:
      *local_38 = 0xffff;
      return (uchar *)0x0;
    }
    *puVar4 = local_3e;
    pmVar5->mcmoptr = (uchar *)(puVar4 + 4);
    pmVar5->mcmosiz = 0x7ff8;
    pmVar5->mcmoflg = 0x80;
    mcmlnkhd(ctx,lst,local_3e);
    uVar3 = 0xffff;
    pmVar5 = (mcmodef *)0x0;
    pmVar7 = lst;
  } while( true );
}

Assistant:

static uchar *mcmalo1(mcmcx1def *ctx, ushort siz, mcmon *nump)
{
    mcmon    n;
    mcmodef *o;
    uchar   *chunk;
    
    MCMGLBCTX(ctx);

    /* round size to appropriate multiple */
    siz = osrndsz(siz);

    /* if it's bigger than the chunk size, we can't allocate it */
    if (siz > MCMCHUNK)
        errsig(ctx->mcmcxerr, ERR_BIGOBJ);

startover:
    /* look in the free block chain for a fit to the request */
    o = mcmffb(ctx, siz, &n);
    if (n != MCMONINV)
    {
        mcmsplt(ctx, n, siz);               /* split the block if necessary */
        mcmgobje(ctx, n)->mcmoflg = MCMOFNODISC | MCMOFLOCK | MCMOFPRES;
        mcmgobje(ctx, n)->mcmolcnt = 1;                /* one locker so far */
        *nump = n;
        return(o->mcmoptr);
    }
    
    /* nothing found; we must get space out of the heap if possible */
    chunk = mcmhalo(ctx);                            /* get space from heap */
    if (!chunk) goto error;           /* can't get any more space from heap */
    o = mcmoal(ctx, &n);               /* set up cache entry for free space */
    if (n == MCMONINV)
    {
        mcmhdef *chunk_hdr = ((mcmhdef *)chunk) - 1;
        ctx->mcmcxhpch = chunk_hdr->mcmhnxt;
        mchfre(chunk_hdr);
        goto error;         /* any error means we can't allocate the memory */
    }
    
    *(mcmon *)chunk = n;                               /* set object header */
    chunk += osrndsz(sizeof(mcmon));
    o->mcmoptr = chunk;
    o->mcmosiz = MCMCHUNK - osrndsz(sizeof(mcmon));
    o->mcmoflg = MCMOFFREE;
    mcmlnkhd(ctx, &ctx->mcmcxfre, n);
    goto startover;              /* try again, now that we have some memory */
    
error:
    *nump = MCMONINV;
    return((uchar *)0);
}